

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

void __thiscall
UnitBoundedPolynomial<3U,_2U>::walk
          (UnitBoundedPolynomial<3U,_2U> *this,double deltatau,
          _func_void_VectorNd_double_UnitBoundedPolynomial<3U,_2U>_ptr_void_ptr *fn,void *payload,
          double a,double b)

{
  undefined8 in_RDX;
  code *in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  UnitBoundedPolynomial<3U,_2U> *in_XMM1_Qa;
  UnitBoundedPolynomial<3U,_2U> *in_XMM2_Qa;
  VectorNd VVar1;
  double tau;
  undefined1 local_48 [16];
  UnitBoundedPolynomial<3U,_2U> *local_38;
  
  for (local_38 = in_XMM1_Qa; (double)local_38 <= (double)in_XMM2_Qa;
      local_38 = (UnitBoundedPolynomial<3U,_2U> *)(in_XMM0_Qa + (double)local_38)) {
    if ((double)in_XMM2_Qa - (double)local_38 < in_XMM0_Qa) {
      local_38 = in_XMM2_Qa;
    }
    VVar1 = interpolate(in_XMM1_Qa,(double)in_XMM2_Qa);
    (*in_RSI)(local_38,VVar1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                       m_data.array[1],local_48,in_RDI,in_RDX);
  }
  return;
}

Assistant:

void UnitBoundedPolynomial<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, double, const UnitBoundedPolynomial<Order, Dims>&, void *), void *payload, double a, double b) const
{
    double tau = a;
    while (tau <= b)
    {
        if (b - tau < deltatau)
        {
            tau = b;
        }

        fn(interpolate(tau), tau, *this, payload);

        tau += deltatau;
    }
}